

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdCompressPubkey(void *handle,char *pubkey,char **output)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  undefined1 local_78 [32];
  Pubkey key;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  cfd::Initialize();
  if (output == (char **)0x0) {
    local_78._0_8_ = "cfdcapi_key.cpp";
    local_78._8_4_ = 0x4e7;
    local_78._16_8_ = "CfdCompressPubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_78,"Failed to parameter. output is null.",(allocator *)&key);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_78,pubkey,(allocator *)&local_40);
    cfd::core::Pubkey::Pubkey(&key,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    cfd::core::Pubkey::Compress((Pubkey *)&local_40,&key);
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_78,(Pubkey *)&local_40);
    pcVar2 = cfd::capi::CreateString((string *)local_78);
    *output = pcVar2;
    std::__cxx11::string::~string((string *)local_78);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    return 0;
  }
  local_78._0_8_ = "cfdcapi_key.cpp";
  local_78._8_4_ = 0x4ed;
  local_78._16_8_ = "CfdCompressPubkey";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"pubkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_78,"Failed to parameter. pubkey is null or empty.",(allocator *)&key);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_78);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCompressPubkey(void* handle, const char* pubkey, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    Pubkey key(pubkey);
    *output = CreateString(key.Compress().GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}